

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O0

void P_SerializePlayers(FSerializer *arc,bool skipload)

{
  bool bVar1;
  char *local_28;
  char *n;
  int i;
  int numPlayersNow;
  int numPlayers;
  bool skipload_local;
  FSerializer *arc_local;
  
  n._4_4_ = 0;
  for (n._0_4_ = 0; (int)n < 8; n._0_4_ = (int)n + 1) {
    if ((playeringame[(int)n] & 1U) != 0) {
      n._4_4_ = n._4_4_ + 1;
    }
  }
  numPlayersNow._3_1_ = skipload;
  _numPlayers = arc;
  bVar1 = FSerializer::isWriting(arc);
  if (bVar1) {
    FSerializer::operator()(_numPlayers,"numplayers",(int *)((long)&n + 4));
    bVar1 = FSerializer::BeginArray(_numPlayers,"players");
    if (bVar1) {
      for (n._0_4_ = 0; (int)n < 8; n._0_4_ = (int)n + 1) {
        if (((playeringame[(int)n] & 1U) != 0) &&
           (bVar1 = FSerializer::BeginObject(_numPlayers,(char *)0x0), bVar1)) {
          local_28 = userinfo_t::GetName((userinfo_t *)((long)(int)n * 0x2a0 + 0x1ae70f8));
          FSerializer::StringPtr(_numPlayers,"playername",&local_28);
          player_t::Serialize((player_t *)(&players + (long)(int)n * 0x54),_numPlayers);
          FSerializer::EndObject(_numPlayers);
        }
      }
      FSerializer::EndArray(_numPlayers);
    }
  }
  else {
    FSerializer::operator()(_numPlayers,"numplayers",&i);
    bVar1 = FSerializer::BeginArray(_numPlayers,"players");
    if (bVar1) {
      if (i == 1) {
        ReadOnePlayer(_numPlayers,(bool)(numPlayersNow._3_1_ & 1));
      }
      else {
        ReadMultiplePlayers(_numPlayers,i,n._4_4_,(bool)(numPlayersNow._3_1_ & 1));
      }
      FSerializer::EndArray(_numPlayers);
    }
    if (((numPlayersNow._3_1_ & 1) == 0) && (i < n._4_4_)) {
      SpawnExtraPlayers();
    }
    player_t::SendPitchLimits((player_t *)(&players + (long)consoleplayer * 0x54));
  }
  return;
}

Assistant:

void P_SerializePlayers(FSerializer &arc, bool skipload)
{
	int numPlayers, numPlayersNow;
	int i;

	// Count the number of players present right now.
	for (numPlayersNow = 0, i = 0; i < MAXPLAYERS; ++i)
	{
		if (playeringame[i])
		{
			++numPlayersNow;
		}
	}

	if (arc.isWriting())
	{
		// Record the number of players in this save.
		arc("numplayers", numPlayersNow);
		if (arc.BeginArray("players"))
		{
			// Record each player's name, followed by their data.
			for (i = 0; i < MAXPLAYERS; ++i)
			{
				if (playeringame[i])
				{
					if (arc.BeginObject(nullptr))
					{
						const char *n = players[i].userinfo.GetName();
						arc.StringPtr("playername", n);
						players[i].Serialize(arc);
						arc.EndObject();
					}
				}
			}
			arc.EndArray();
		}
	}
	else
	{
		arc("numplayers", numPlayers);

		if (arc.BeginArray("players"))
		{
			// If there is only one player in the game, they go to the
			// first player present, no matter what their name.
			if (numPlayers == 1)
			{
				ReadOnePlayer(arc, skipload);
			}
			else
			{
				ReadMultiplePlayers(arc, numPlayers, numPlayersNow, skipload);
			}
			arc.EndArray();
		}
		if (!skipload && numPlayersNow > numPlayers)
		{
			SpawnExtraPlayers();
		}
		// Redo pitch limits, since the spawned player has them at 0.
		players[consoleplayer].SendPitchLimits();
	}
}